

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O0

void __thiscall ImGuiViewportP::ImGuiViewportP(ImGuiViewportP *this)

{
  ImVec2 local_24 [2];
  ImGuiViewportP *local_10;
  ImGuiViewportP *this_local;
  
  local_10 = this;
  ImGuiViewport::ImGuiViewport(&this->super_ImGuiViewport);
  ImVec2::ImVec2(&this->LastPos);
  ImDrawData::ImDrawData(&this->DrawDataP);
  ImDrawDataBuilder::ImDrawDataBuilder(&this->DrawDataBuilder);
  ImVec2::ImVec2(&this->LastPlatformPos);
  ImVec2::ImVec2(&this->LastPlatformSize);
  ImVec2::ImVec2(&this->LastRendererSize);
  ImVec2::ImVec2(&this->WorkOffsetMin);
  ImVec2::ImVec2(&this->WorkOffsetMax);
  ImVec2::ImVec2(&this->BuildWorkOffsetMin);
  ImVec2::ImVec2(&this->BuildWorkOffsetMax);
  *(undefined4 *)&(this->super_ImGuiViewport).field_0x5c = 0xffffffff;
  this->LastFrontMostStampCount = -1;
  this->DrawListsLastFrame[1] = -1;
  this->DrawListsLastFrame[0] = -1;
  this->LastFrameActive = -1;
  this->LastNameHash = 0;
  this->LastAlpha = 1.0;
  this->Alpha = 1.0;
  this->PlatformMonitor = -1;
  this->PlatformWindowCreated = false;
  this->Window = (ImGuiWindow *)0x0;
  this->DrawLists[1] = (ImDrawList *)0x0;
  this->DrawLists[0] = (ImDrawList *)0x0;
  ImVec2::ImVec2(local_24,3.4028235e+38,3.4028235e+38);
  this->LastRendererSize = local_24[0];
  this->LastPlatformSize = this->LastRendererSize;
  this->LastPlatformPos = this->LastPlatformSize;
  return;
}

Assistant:

ImGuiViewportP()                    { Idx = -1; LastFrameActive = DrawListsLastFrame[0] = DrawListsLastFrame[1] = LastFrontMostStampCount = -1; LastNameHash = 0; Alpha = LastAlpha = 1.0f; PlatformMonitor = -1; PlatformWindowCreated = false; Window = NULL; DrawLists[0] = DrawLists[1] = NULL; LastPlatformPos = LastPlatformSize = LastRendererSize = ImVec2(FLT_MAX, FLT_MAX); }